

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

int xmlSchemaParseUInt(xmlChar **str,unsigned_long *llo,unsigned_long *lmi,unsigned_long *lhi)

{
  byte *pbVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  byte *pbVar6;
  byte bVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  ulong uVar10;
  
  pbVar6 = *str;
  bVar7 = *pbVar6;
  if ((byte)(bVar7 - 0x30) < 10) {
    while (bVar7 == 0x30) {
      pbVar1 = pbVar6 + 1;
      pbVar6 = pbVar6 + 1;
      bVar7 = *pbVar1;
    }
    uVar4 = 0;
    while ((byte)(bVar7 - 0x30) < 10) {
      lVar2 = uVar4 + 1;
      uVar4 = uVar4 + 1;
      bVar7 = pbVar6[lVar2];
    }
    uVar3 = (uint)uVar4;
    if (uVar3 < 0x19) {
      uVar8 = 0;
      for (uVar10 = uVar4 & 0xffffffff; 0x10 < (uint)uVar10; uVar10 = (ulong)((uint)uVar10 - 1)) {
        bVar7 = *pbVar6;
        pbVar6 = pbVar6 + 1;
        uVar8 = (uVar8 * 10 + (ulong)bVar7) - 0x30;
      }
      uVar10 = 0x10;
      if (uVar3 < 0x10) {
        uVar10 = uVar4 & 0xffffffff;
      }
      uVar9 = 0;
      for (; 8 < (uint)uVar10; uVar10 = (ulong)((uint)uVar10 - 1)) {
        bVar7 = *pbVar6;
        pbVar6 = pbVar6 + 1;
        uVar9 = (uVar9 * 10 + (ulong)bVar7) - 0x30;
      }
      uVar10 = 8;
      if (uVar3 < 8) {
        uVar10 = uVar4 & 0xffffffff;
      }
      uVar5 = 0;
      for (; 0 < (int)uVar10; uVar10 = (ulong)((int)uVar10 - 1)) {
        bVar7 = *pbVar6;
        pbVar6 = pbVar6 + 1;
        uVar5 = (uVar5 * 10 + (ulong)bVar7) - 0x30;
      }
      *str = pbVar6;
      *llo = uVar5;
      *lmi = uVar9;
      *lhi = uVar8;
    }
    else {
      *str = pbVar6 + uVar4;
      uVar4 = 0xffffffff;
    }
  }
  else {
    uVar4 = 0xfffffffe;
  }
  return (int)uVar4;
}

Assistant:

static int
xmlSchemaParseUInt(const xmlChar **str, unsigned long *llo,
                   unsigned long *lmi, unsigned long *lhi) {
    unsigned long lo = 0, mi = 0, hi = 0;
    const xmlChar *tmp, *cur = *str;
    int ret = 0, i = 0;

    if (!((*cur >= '0') && (*cur <= '9')))
        return(-2);

    while (*cur == '0') {        /* ignore leading zeroes */
        cur++;
    }
    tmp = cur;
    while ((*tmp != 0) && (*tmp >= '0') && (*tmp <= '9')) {
        i++;tmp++;ret++;
    }
    if (i > 24) {
        *str = tmp;
        return(-1);
    }
    while (i > 16) {
        hi = hi * 10 + (*cur++ - '0');
        i--;
    }
    while (i > 8) {
        mi = mi * 10 + (*cur++ - '0');
        i--;
    }
    while (i > 0) {
        lo = lo * 10 + (*cur++ - '0');
        i--;
    }

    *str = cur;
    *llo = lo;
    *lmi = mi;
    *lhi = hi;
    return(ret);
}